

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wedge_utils_avx2.c
# Opt level: O1

void av1_wedge_compute_delta_squares_avx2(int16_t *d,int16_t *a,int16_t *b,int N)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  long lVar14;
  undefined1 auVar15 [32];
  
  lVar14 = 0;
  auVar15._8_4_ = 0xffff0001;
  auVar15._0_8_ = 0xffff0001ffff0001;
  auVar15._12_4_ = 0xffff0001;
  auVar15._16_4_ = 0xffff0001;
  auVar15._20_4_ = 0xffff0001;
  auVar15._24_4_ = 0xffff0001;
  auVar15._28_4_ = 0xffff0001;
  do {
    auVar1 = vlddqu_avx(*(undefined1 (*) [32])a);
    auVar2 = vlddqu_avx(*(undefined1 (*) [32])b);
    auVar3 = vlddqu_avx(*(undefined1 (*) [32])((long)a + 0x20));
    auVar4 = vlddqu_avx(*(undefined1 (*) [32])((long)b + 0x20));
    auVar5 = vlddqu_avx(*(undefined1 (*) [32])((long)a + 0x40));
    auVar6 = vlddqu_avx(*(undefined1 (*) [32])((long)b + 0x40));
    auVar7 = vlddqu_avx(*(undefined1 (*) [32])((long)a + 0x60));
    auVar8 = vlddqu_avx(*(undefined1 (*) [32])((long)b + 0x60));
    auVar10 = vpunpcklwd_avx2(auVar1,auVar2);
    auVar9 = vpunpckhwd_avx2(auVar1,auVar2);
    auVar11 = vpunpcklwd_avx2(auVar3,auVar4);
    auVar4 = vpunpckhwd_avx2(auVar3,auVar4);
    auVar12 = vpunpcklwd_avx2(auVar5,auVar6);
    auVar5 = vpunpckhwd_avx2(auVar5,auVar6);
    auVar13 = vpunpcklwd_avx2(auVar7,auVar8);
    auVar6 = vpunpckhwd_avx2(auVar7,auVar8);
    auVar1 = vpsignw_avx2(auVar10,auVar15);
    auVar1 = vpmaddwd_avx2(auVar10,auVar1);
    auVar2 = vpsignw_avx2(auVar9,auVar15);
    auVar2 = vpmaddwd_avx2(auVar2,auVar9);
    auVar1 = vpackssdw_avx2(auVar1,auVar2);
    auVar2 = vpsignw_avx2(auVar11,auVar15);
    auVar2 = vpmaddwd_avx2(auVar2,auVar11);
    auVar3 = vpsignw_avx2(auVar4,auVar15);
    auVar3 = vpmaddwd_avx2(auVar3,auVar4);
    auVar2 = vpackssdw_avx2(auVar2,auVar3);
    auVar3 = vpsignw_avx2(auVar12,auVar15);
    auVar3 = vpmaddwd_avx2(auVar12,auVar3);
    auVar4 = vpsignw_avx2(auVar5,auVar15);
    auVar4 = vpmaddwd_avx2(auVar5,auVar4);
    auVar3 = vpackssdw_avx2(auVar3,auVar4);
    auVar4 = vpsignw_avx2(auVar13,auVar15);
    auVar4 = vpmaddwd_avx2(auVar13,auVar4);
    auVar5 = vpsignw_avx2(auVar6,auVar15);
    auVar5 = vpmaddwd_avx2(auVar6,auVar5);
    auVar4 = vpackssdw_avx2(auVar4,auVar5);
    *(undefined1 (*) [32])(d + lVar14) = auVar1;
    *(undefined1 (*) [32])(d + lVar14 + 0x10) = auVar2;
    *(undefined1 (*) [32])(d + lVar14 + 0x20) = auVar3;
    *(undefined1 (*) [32])(d + lVar14 + 0x30) = auVar4;
    lVar14 = lVar14 + 0x40;
    a = (int16_t *)((long)a + 0x80);
    b = (int16_t *)((long)b + 0x80);
  } while (N != (int)lVar14);
  return;
}

Assistant:

void av1_wedge_compute_delta_squares_avx2(int16_t *d, const int16_t *a,
                                          const int16_t *b, int N) {
  const __m256i v_neg_w = _mm256_set1_epi32((int)0xffff0001);

  assert(N % 64 == 0);

  do {
    const __m256i v_a0_w = _mm256_lddqu_si256((__m256i *)(a));
    const __m256i v_b0_w = _mm256_lddqu_si256((__m256i *)(b));
    const __m256i v_a1_w = _mm256_lddqu_si256((__m256i *)(a + 16));
    const __m256i v_b1_w = _mm256_lddqu_si256((__m256i *)(b + 16));
    const __m256i v_a2_w = _mm256_lddqu_si256((__m256i *)(a + 32));
    const __m256i v_b2_w = _mm256_lddqu_si256((__m256i *)(b + 32));
    const __m256i v_a3_w = _mm256_lddqu_si256((__m256i *)(a + 48));
    const __m256i v_b3_w = _mm256_lddqu_si256((__m256i *)(b + 48));

    const __m256i v_ab0l_w = _mm256_unpacklo_epi16(v_a0_w, v_b0_w);
    const __m256i v_ab0h_w = _mm256_unpackhi_epi16(v_a0_w, v_b0_w);
    const __m256i v_ab1l_w = _mm256_unpacklo_epi16(v_a1_w, v_b1_w);
    const __m256i v_ab1h_w = _mm256_unpackhi_epi16(v_a1_w, v_b1_w);
    const __m256i v_ab2l_w = _mm256_unpacklo_epi16(v_a2_w, v_b2_w);
    const __m256i v_ab2h_w = _mm256_unpackhi_epi16(v_a2_w, v_b2_w);
    const __m256i v_ab3l_w = _mm256_unpacklo_epi16(v_a3_w, v_b3_w);
    const __m256i v_ab3h_w = _mm256_unpackhi_epi16(v_a3_w, v_b3_w);

    // Negate top word of pairs
    const __m256i v_abl0n_w = _mm256_sign_epi16(v_ab0l_w, v_neg_w);
    const __m256i v_abh0n_w = _mm256_sign_epi16(v_ab0h_w, v_neg_w);
    const __m256i v_abl1n_w = _mm256_sign_epi16(v_ab1l_w, v_neg_w);
    const __m256i v_abh1n_w = _mm256_sign_epi16(v_ab1h_w, v_neg_w);
    const __m256i v_abl2n_w = _mm256_sign_epi16(v_ab2l_w, v_neg_w);
    const __m256i v_abh2n_w = _mm256_sign_epi16(v_ab2h_w, v_neg_w);
    const __m256i v_abl3n_w = _mm256_sign_epi16(v_ab3l_w, v_neg_w);
    const __m256i v_abh3n_w = _mm256_sign_epi16(v_ab3h_w, v_neg_w);

    const __m256i v_r0l_w = _mm256_madd_epi16(v_ab0l_w, v_abl0n_w);
    const __m256i v_r0h_w = _mm256_madd_epi16(v_ab0h_w, v_abh0n_w);
    const __m256i v_r1l_w = _mm256_madd_epi16(v_ab1l_w, v_abl1n_w);
    const __m256i v_r1h_w = _mm256_madd_epi16(v_ab1h_w, v_abh1n_w);
    const __m256i v_r2l_w = _mm256_madd_epi16(v_ab2l_w, v_abl2n_w);
    const __m256i v_r2h_w = _mm256_madd_epi16(v_ab2h_w, v_abh2n_w);
    const __m256i v_r3l_w = _mm256_madd_epi16(v_ab3l_w, v_abl3n_w);
    const __m256i v_r3h_w = _mm256_madd_epi16(v_ab3h_w, v_abh3n_w);

    const __m256i v_r0_w = _mm256_packs_epi32(v_r0l_w, v_r0h_w);
    const __m256i v_r1_w = _mm256_packs_epi32(v_r1l_w, v_r1h_w);
    const __m256i v_r2_w = _mm256_packs_epi32(v_r2l_w, v_r2h_w);
    const __m256i v_r3_w = _mm256_packs_epi32(v_r3l_w, v_r3h_w);

    _mm256_store_si256((__m256i *)(d), v_r0_w);
    _mm256_store_si256((__m256i *)(d + 16), v_r1_w);
    _mm256_store_si256((__m256i *)(d + 32), v_r2_w);
    _mm256_store_si256((__m256i *)(d + 48), v_r3_w);

    a += 64;
    b += 64;
    d += 64;
    N -= 64;
  } while (N);
}